

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType>
          (QVLABase<Qt::GestureType> *this,qsizetype prealloc,void *array,GestureType *args)

{
  QVLABase<Qt::GestureType> *this_00;
  QVLABase<Qt::GestureType> *pQVar1;
  iterator ptr;
  GestureType *pGVar2;
  GestureType *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<Qt::GestureType> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<Qt::GestureType> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<Qt::GestureType> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = end(this_00);
  pGVar2 = q20::construct_at<Qt::GestureType,Qt::GestureType,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pGVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }